

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::resize(raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *this,size_t new_capacity)

{
  slot_type *psVar1;
  slot_type *psVar2;
  size_t capacity;
  pointer pcVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  size_t sVar6;
  size_t i;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  size_t sVar9;
  FindInfo FVar10;
  Layout LVar11;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_39;
  ctrl_t *local_38;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    local_38 = this->ctrl_;
    psVar2 = this->slots_;
    capacity = this->capacity_;
    initialize_slots(this,new_capacity);
    this->capacity_ = new_capacity;
    if (capacity != 0) {
      paVar8 = &(psVar2->value).first.field_2;
      sVar9 = 0;
      do {
        if (-1 < local_38[sVar9]) {
          sVar6 = std::
                  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(&local_39,(string *)(paVar8 + -1));
          auVar4._8_8_ = 0;
          auVar4._0_8_ = sVar6;
          sVar6 = SUB168(auVar4 * ZEXT816(0xde5fb9d2630458e9),8) +
                  SUB168(auVar4 * ZEXT816(0xde5fb9d2630458e9),0);
          FVar10 = find_first_non_full(this,sVar6);
          i = FVar10.offset;
          set_ctrl(this,i,(byte)sVar6 & 0x7f);
          psVar2 = this->slots_ + i;
          psVar1 = this->slots_ + i;
          paVar7 = &(psVar1->value).first.field_2;
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)psVar1 = paVar7;
          pcVar3 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (paVar8 + -1))->_M_dataplus)._M_p;
          if (paVar8 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)pcVar3) {
            uVar5 = *(undefined8 *)((long)paVar8 + 8);
            paVar7->_M_allocated_capacity = paVar8->_M_allocated_capacity;
            *(undefined8 *)((long)&(psVar1->value).first.field_2 + 8) = uVar5;
          }
          else {
            (psVar2->value).first._M_dataplus._M_p = pcVar3;
            (psVar2->value).first.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          }
          (psVar2->value).first._M_string_length = *(size_type *)((long)paVar8 + -8);
          (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar8 + -1))->
          _M_dataplus)._M_p = (pointer)paVar8;
          *(size_type *)((long)paVar8 + -8) = 0;
          paVar8->_M_local_buf[0] = '\0';
          (psVar2->value).second = *(int *)(paVar8 + 1);
        }
        sVar9 = sVar9 + 1;
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((long)paVar8 + 0x28);
      } while (capacity != sVar9);
      LVar11 = MakeLayout(capacity);
      Deallocate<8ul,phmap::priv::Alloc<std::pair<std::__cxx11::string_const,int>>>
                ((Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                  *)&this->settings_,local_38,
                 (LVar11.
                  super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<std::__cxx11::basic_string<char>,_int>_>
                  .size_[0] + 7 & 0xfffffffffffffff8) +
                 LVar11.
                 super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<std::__cxx11::basic_string<char>,_int>_>
                 .size_[1] * 0x28);
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x807,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::basic_string<char>, int>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<std::pair<const std::basic_string<char>, int>>>::resize(size_t) [Policy = phmap::priv::FlatHashMapPolicy<std::basic_string<char>, int>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<std::pair<const std::basic_string<char>, int>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }